

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_panner_process_pcm_frames
                    (ma_panner *pPanner,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  undefined8 in_RCX;
  ma_uint64 in_RDX;
  void *in_RSI;
  void *in_RDI;
  ma_format mVar1;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  ma_result mVar2;
  
  if (((in_RDI == (void *)0x0) || (in_RSI == (void *)0x0)) || (in_RDX == 0)) {
    mVar2 = MA_INVALID_ARGS;
  }
  else {
    if (*(int *)((long)in_RDI + 4) == 2) {
      mVar1 = (ma_format)((ulong)in_RCX >> 0x20);
      if (*(int *)((long)in_RDI + 8) == 0) {
        ma_stereo_balance_pcm_frames(in_RDI,in_RSI,in_RDX,mVar1,(float)in_RCX);
      }
      else {
        ma_stereo_pan_pcm_frames(in_RDI,in_RSI,in_RDX,mVar1,(float)in_RCX);
      }
    }
    else {
      mVar1 = (ma_format)((ulong)in_RSI >> 0x20);
      if (*(int *)((long)in_RDI + 4) == 1) {
        ma_copy_pcm_frames((void *)frameCount,
                           (void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           (ma_uint64)in_RDI,mVar1,(ma_uint32)in_RSI);
      }
      else {
        ma_copy_pcm_frames((void *)frameCount,
                           (void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           (ma_uint64)in_RDI,mVar1,(ma_uint32)in_RSI);
      }
    }
    mVar2 = MA_SUCCESS;
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_panner_process_pcm_frames(ma_panner* pPanner, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    if (pPanner == NULL || pFramesOut == NULL || pFramesIn == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pPanner->channels == 2) {
        /* Stereo case. For now assume channel 0 is left and channel right is 1, but should probably add support for a channel map. */
        if (pPanner->mode == ma_pan_mode_balance) {
            ma_stereo_balance_pcm_frames(pFramesOut, pFramesIn, frameCount, pPanner->format, pPanner->pan);
        } else {
            ma_stereo_pan_pcm_frames(pFramesOut, pFramesIn, frameCount, pPanner->format, pPanner->pan);
        }
    } else {
        if (pPanner->channels == 1) {
            /* Panning has no effect on mono streams. */
            ma_copy_pcm_frames(pFramesOut, pFramesIn, frameCount, pPanner->format, pPanner->channels);
        } else {
            /* For now we're not going to support non-stereo set ups. Not sure how I want to handle this case just yet. */
            ma_copy_pcm_frames(pFramesOut, pFramesIn, frameCount, pPanner->format, pPanner->channels);
        }
    }

    return MA_SUCCESS;
}